

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

Am_Explicit_Set * Am_Explicit_Set::Narrow(Am_Constraint *formula)

{
  Am_ID_Tag AVar1;
  int iVar2;
  
  AVar1 = id;
  iVar2 = (**(formula->super_Am_Registered_Type)._vptr_Am_Registered_Type)();
  if (AVar1 == (Am_ID_Tag)iVar2) {
    return (Am_Explicit_Set *)formula;
  }
  Am_Error("Constraint narrowed to Explicit_Set type is not an Explicit_Set.");
}

Assistant:

Am_Explicit_Set *
Am_Explicit_Set::Narrow(Am_Constraint *formula)
{
  if (id == formula->ID())
    return (Am_Explicit_Set *)formula;
  else {
    Am_Error(
        "Constraint narrowed to Explicit_Set type is not an Explicit_Set.");
    return nullptr;
  }
}